

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSchema
          (MessageGenerator *this,Printer *p,int offset)

{
  Descriptor *desc;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  allocator<char> local_1e5;
  int offset_local;
  string local_1e0;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Sub local_1a8;
  Options local_f0;
  
  desc = this->descriptor_;
  offset_local = offset;
  Options::Options(&local_f0,&this->options_);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_1a8,desc,&local_f0);
  vars.len_ = (long)(local_1a8.key_._M_string_length - (long)local_1a8.key_._M_dataplus._M_p) / 0xb8
  ;
  vars.ptr_ = (pointer)local_1a8.key_._M_dataplus._M_p;
  io::Printer::WithVars(&v,p,vars);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_1a8);
  Options::~Options(&local_f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"offset",&local_1e5);
  io::Printer::Sub::Sub<int&>(&local_1a8,&local_1e0,&offset_local);
  io::Printer::Emit(p,&local_1a8,1,0x30,"\n        {$offset$, sizeof($classtype$)},\n      ");
  io::Printer::Sub::~Sub(&local_1a8);
  std::__cxx11::string::~string((string *)&local_1e0);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

void MessageGenerator::GenerateSchema(io::Printer* p, int offset) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  p->Emit(
      {
          {"offset", offset},
      },
      R"cc(
        {$offset$, sizeof($classtype$)},
      )cc");
}